

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ReadFileResult
cmCMakePresetsGraphInternal::PresetOptionalBoolHelper(optional<bool> *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  
  if (PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::
                                 helper);
    if (iVar2 != 0) {
      PresetOptionalBoolHelper::helper.super__Function_base._M_functor._M_unused._M_object =
           (void *)0x0;
      PresetOptionalBoolHelper::helper.super__Function_base._M_functor._8_8_ = PresetBoolHelper;
      PresetOptionalBoolHelper::helper._M_invoker =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::optional<bool>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:281:12)>
           ::_M_invoke;
      PresetOptionalBoolHelper::helper.super__Function_base._M_manager =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::optional<bool>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:281:12)>
           ::_M_manager;
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetOptionalBoolHelper::helper,
                   &__dso_handle);
      __cxa_guard_release(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::helper
                         );
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::optional<bool>_&,_const_Json::Value_*)>
          ::operator()(&PresetOptionalBoolHelper::helper,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetOptionalBoolHelper(
  cm::optional<bool>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Optional<bool>(
    ReadFileResult::READ_OK, PresetBoolHelper);

  return helper(out, value);
}